

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O0

int __thiscall ncnn::LSTM::forward(LSTM *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  void *__src;
  void *__dest;
  Allocator *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float *ptr_4;
  float *pr;
  float *pf;
  int i_4;
  int ret1;
  int ret0;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  int ret;
  Mat cell;
  Mat hidden;
  int num_directions;
  int T;
  int i_3;
  float *ptr_3;
  int size_3;
  int i_2;
  float *ptr_2;
  int size_2;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_ffffffffffffefd8;
  size_t in_stack_ffffffffffffefe0;
  int in_stack_ffffffffffffefe8;
  int in_stack_ffffffffffffefec;
  Mat *in_stack_ffffffffffffeff0;
  undefined4 **ppuVar4;
  bool local_e99;
  bool local_e79;
  Mat *in_stack_fffffffffffff200;
  Mat *in_stack_fffffffffffff208;
  undefined4 in_stack_fffffffffffff210;
  undefined4 in_stack_fffffffffffff214;
  undefined8 in_stack_fffffffffffff218;
  Mat *in_stack_fffffffffffff220;
  uint7 in_stack_fffffffffffff228;
  bool local_dc2;
  bool local_db1;
  bool local_d81;
  int local_d64;
  void *local_d60;
  int *local_d58;
  ulong local_d50;
  undefined4 local_d48;
  long *local_d40;
  int local_d38;
  int local_d34;
  int local_d30;
  undefined4 local_d2c;
  undefined4 local_d28;
  ulong local_d20;
  void *local_d18;
  int *local_d10;
  ulong local_d08;
  undefined4 local_d00;
  long *local_cf8;
  int local_cf0;
  int local_cec;
  int local_ce8;
  undefined4 local_ce4;
  undefined4 local_ce0;
  ulong local_cd8;
  void *local_cd0;
  int *local_cc8;
  ulong local_cc0;
  undefined4 local_cb8;
  long *local_cb0;
  int local_ca8;
  int local_ca4;
  int local_ca0;
  undefined4 local_c9c;
  undefined4 local_c98;
  ulong local_c90;
  int local_c84;
  void *local_c80;
  int *local_c78;
  ulong local_c70;
  undefined4 local_c68;
  long *local_c60;
  int local_c58;
  int local_c54;
  int local_c50;
  undefined4 local_c4c;
  undefined4 local_c48;
  ulong local_c40;
  void *local_c38;
  int *local_c30;
  long local_c28;
  undefined4 local_c20;
  long *local_c18;
  undefined4 in_stack_fffffffffffff3f0;
  undefined4 in_stack_fffffffffffff3f4;
  undefined4 uVar5;
  undefined4 uVar6;
  Mat *in_stack_fffffffffffff3f8;
  undefined4 uVar7;
  Option *in_stack_fffffffffffff400;
  void *local_bf0;
  int *local_be8;
  ulong local_be0;
  undefined4 local_bd8;
  long *local_bd0;
  int local_bc8;
  int local_bc4;
  int local_bc0;
  undefined4 local_bbc;
  undefined4 local_bb8;
  ulong local_bb0;
  int local_ba4;
  void *local_ba0;
  int *local_b98;
  long local_b90;
  undefined4 local_b88;
  long *local_b80;
  undefined4 local_b78;
  int local_b74;
  undefined4 local_b70;
  undefined4 local_b6c;
  int local_b68;
  long local_b60;
  void *local_b58;
  int *local_b50;
  long local_b48;
  undefined4 local_b40;
  long *local_b38;
  undefined4 local_b30;
  int local_b2c;
  undefined4 local_b28;
  undefined4 local_b24;
  int local_b20;
  long local_b18;
  void *local_b10;
  int *local_b08;
  ulong local_b00;
  undefined4 local_af8;
  long *local_af0;
  int local_ae8;
  int local_ae4;
  int local_ae0;
  undefined4 local_adc;
  undefined4 local_ad8;
  ulong local_ad0;
  void *local_ac8;
  int *local_ac0;
  ulong local_ab8;
  undefined4 local_ab0;
  long *local_aa8;
  int local_aa0;
  int local_a9c;
  int local_a98;
  undefined4 local_a94;
  undefined4 local_a90;
  ulong local_a88;
  Mat local_a80;
  int local_a34;
  undefined4 *local_a30;
  int *local_a28;
  undefined8 local_a20;
  undefined4 local_a18;
  long *local_a10;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  undefined4 local_9fc;
  int local_9f8;
  long local_9f0;
  int local_9e8;
  undefined4 *local_9d8;
  int *local_9d0;
  undefined8 local_9c8;
  undefined4 local_9c0;
  long *local_9b8;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  int local_9a0;
  long local_998;
  undefined4 local_990;
  int local_98c;
  Allocator *local_988;
  Mat *local_980;
  Mat *local_978;
  int local_964;
  void **local_960;
  void **local_950;
  Mat *local_940;
  void **local_930;
  void **local_920;
  void **local_910;
  void **local_900;
  void **local_8f0;
  void **local_8e0;
  void **local_8d0;
  void **local_8c0;
  undefined4 **local_8b0;
  undefined4 **local_8a0;
  void **local_890;
  void **local_888;
  Mat *local_880;
  undefined4 **local_878;
  undefined4 **local_870;
  _func_int **local_868;
  undefined8 local_860;
  undefined4 local_854;
  undefined4 **local_850;
  _func_int **local_848;
  undefined8 local_840;
  undefined4 local_834;
  undefined4 **local_830;
  int local_824;
  undefined4 *local_820;
  int local_818;
  undefined4 local_814;
  undefined4 **local_810;
  int local_804;
  undefined4 *local_800;
  int local_7f8;
  undefined4 local_7f4;
  undefined4 **local_7f0;
  int local_7e4;
  undefined4 *local_7e0;
  int local_7d8;
  undefined4 local_7d4;
  undefined4 **local_7d0;
  int local_7c4;
  undefined4 *local_7c0;
  int local_7b8;
  undefined4 local_7b4;
  undefined4 **local_7b0;
  undefined1 local_7a5;
  undefined4 local_7a4;
  long *local_7a0;
  void **local_798;
  undefined1 local_785;
  undefined4 local_784;
  long *local_780;
  void **local_778;
  undefined1 local_765;
  undefined4 local_764;
  long *local_760;
  void **local_758;
  undefined1 local_745;
  undefined4 local_744;
  undefined8 *local_740;
  void **local_738;
  undefined1 local_725;
  undefined4 local_724;
  undefined8 *local_720;
  void **local_718;
  undefined1 local_705;
  undefined4 local_704;
  undefined8 *local_700;
  void **local_6f8;
  undefined1 local_6e5;
  undefined4 local_6e4;
  undefined8 *local_6e0;
  void **local_6d8;
  undefined1 local_6c5;
  undefined4 local_6c4;
  undefined8 *local_6c0;
  void **local_6b8;
  undefined1 local_6a5;
  undefined4 local_6a4;
  undefined8 *local_6a0;
  Mat *local_698;
  _func_int **local_688;
  undefined8 local_680;
  int local_678;
  undefined4 local_674;
  void **local_670;
  _func_int **local_668;
  undefined8 local_660;
  int local_658;
  undefined4 local_654;
  void **local_650;
  int local_644;
  Mat *local_640;
  int local_634;
  void **local_630;
  int local_624;
  void **local_620;
  int local_578;
  undefined4 local_574;
  undefined4 **local_570;
  int local_558;
  undefined4 local_554;
  undefined4 **local_550;
  int local_538;
  undefined4 local_534;
  void **local_530;
  int local_518;
  undefined4 local_514;
  void **local_510;
  int local_4f8;
  undefined4 local_4f4;
  void **local_4f0;
  int local_4d8;
  undefined4 local_4d4;
  void **local_4d0;
  int local_4b8;
  undefined4 local_4b4;
  void **local_4b0;
  int local_498;
  undefined4 local_494;
  void **local_490;
  int local_478;
  undefined4 local_474;
  void **local_470;
  int local_458;
  undefined4 local_454;
  void **local_450;
  int local_438;
  undefined4 local_434;
  Mat *local_430;
  int local_418;
  undefined4 local_414;
  void **local_410;
  int local_3f8;
  undefined4 local_3f4;
  void **local_3f0;
  void *local_3e8;
  void *local_3d8;
  void *local_3c8;
  void *local_3b8;
  void *local_3a8;
  void *local_398;
  void *local_388;
  void *local_378;
  void *local_368;
  void *local_358;
  void *local_348;
  undefined4 *local_338;
  undefined4 *local_328;
  undefined4 **local_2d0;
  undefined4 **local_2c8;
  undefined4 **local_2c0;
  undefined4 **local_2b8;
  undefined4 **local_2b0;
  undefined4 **local_2a8;
  Mat *local_2a0;
  void **local_298;
  void **local_290;
  Allocator *local_288;
  int local_27c;
  ulong local_278;
  void *local_270;
  int local_264;
  int local_260;
  int local_25c;
  Mat *local_258;
  long *local_250;
  undefined4 local_244;
  ulong local_240;
  void *local_238;
  undefined4 local_22c;
  int local_228;
  int local_224;
  void **local_220;
  long *local_218;
  undefined4 local_20c;
  ulong local_208;
  void *local_200;
  undefined4 local_1f4;
  int local_1f0;
  int local_1ec;
  void **local_1e8;
  long *local_1e0;
  undefined4 local_1d4;
  ulong local_1d0;
  void *local_1c8;
  undefined4 local_1bc;
  int local_1b8;
  int local_1b4;
  void **local_1b0;
  long *local_1a8;
  undefined4 local_19c;
  long local_198;
  void *local_190;
  undefined4 local_184;
  undefined4 local_180;
  int local_17c;
  void **local_178;
  long *local_170;
  undefined4 local_164;
  ulong local_160;
  void *local_158;
  undefined4 local_14c;
  int local_148;
  int local_144;
  void **local_140;
  long *local_138;
  undefined4 local_12c;
  ulong local_128;
  void *local_120;
  undefined4 local_114;
  int local_110;
  int local_10c;
  void **local_108;
  long *local_100;
  undefined4 local_f4;
  ulong local_f0;
  void *local_e8;
  undefined4 local_dc;
  int local_d8;
  int local_d4;
  void **local_d0;
  long *local_c8;
  undefined4 local_bc;
  ulong local_b8;
  void *local_b0;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  void **local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffff218 >> 0x20);
  local_98c = in_RSI->h;
  local_990 = 1;
  if (*(int *)(in_RDI + 0xd8) == 2) {
    local_990 = 2;
  }
  local_854 = *(undefined4 *)(in_RDI + 0xd0);
  local_868 = in_RCX[2]._vptr_Allocator;
  local_850 = &local_9d8;
  local_860 = 4;
  local_9d8 = (undefined4 *)0x0;
  local_9d0 = (int *)0x0;
  local_9c8 = 0;
  local_9c0 = 0;
  local_9b8 = (long *)0x0;
  local_9b0 = 0;
  local_9ac = 0;
  local_9a8 = 0;
  local_9a4 = 0;
  local_9a0 = 0;
  local_998 = 0;
  local_988 = in_RCX;
  local_980 = in_RDX;
  local_978 = in_RSI;
  Mat::create(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,in_stack_ffffffffffffefe0,
              in_stack_ffffffffffffefd8);
  local_870 = &local_9d8;
  if (local_9d8 != (undefined4 *)0x0) {
    local_2b0 = local_870;
  }
  local_d81 = local_9d8 == (undefined4 *)0x0 || local_998 * local_9a0 == 0;
  if (local_d81) {
    local_964 = -100;
    local_9e8 = 1;
    goto LAB_0128f506;
  }
  local_7b0 = &local_9d8;
  local_7b4 = 0;
  local_7b8 = (int)local_998 * local_9a0;
  local_7c0 = local_9d8;
  for (local_7c4 = 0; local_7c4 < local_7b8; local_7c4 = local_7c4 + 1) {
    *local_7c0 = 0;
    local_7c0 = local_7c0 + 1;
  }
  local_834 = *(undefined4 *)(in_RDI + 0xd0);
  local_848 = local_988[2]._vptr_Allocator;
  local_830 = &local_a30;
  local_840 = 4;
  local_a30 = (undefined4 *)0x0;
  local_a28 = (int *)0x0;
  local_a20 = 0;
  local_a18 = 0;
  local_a10 = (long *)0x0;
  local_a08 = 0;
  local_a04 = 0;
  local_a00 = 0;
  local_9fc = 0;
  local_9f8 = 0;
  local_9f0 = 0;
  local_2d0 = local_7b0;
  Mat::create(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,in_stack_ffffffffffffefe0,
              in_stack_ffffffffffffefd8);
  local_878 = &local_a30;
  if (local_a30 != (undefined4 *)0x0) {
    local_2a8 = local_878;
  }
  local_db1 = local_a30 != (undefined4 *)0x0 && local_9f0 * local_9f8 != 0;
  if (local_db1) {
    local_7d0 = &local_a30;
    local_7d4 = 0;
    local_7d8 = (int)local_9f0 * local_9f8;
    local_7e0 = local_a30;
    for (local_7e4 = 0; local_7e4 < local_7d8; local_7e4 = local_7e4 + 1) {
      *local_7e0 = 0;
      local_7e0 = local_7e0 + 1;
    }
    local_2c8 = local_7d0;
    Mat::create(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8,
                in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    local_880 = local_980;
    local_dc2 = true;
    if (local_980->data != (void *)0x0) {
      local_2a0 = local_980;
      local_dc2 = local_980->cstep * (long)local_980->c == 0;
    }
    if (local_dc2 == false) {
      if ((*(int *)(in_RDI + 0xd8) == 0) || (*(int *)(in_RDI + 0xd8) == 1)) {
        in_stack_fffffffffffff214 = *(undefined4 *)(in_RDI + 0xd8);
        puVar3 = (undefined8 *)(in_RDI + 0x128);
        local_698 = &local_a80;
        local_6a4 = 0;
        local_25c = *(int *)(in_RDI + 0x154);
        local_260 = *(int *)(in_RDI + 0x158);
        local_264 = *(int *)(in_RDI + 0x15c);
        local_270 = (void *)*puVar3;
        local_278 = *(ulong *)(in_RDI + 0x138);
        local_27c = *(int *)(in_RDI + 0x140);
        local_288 = *(Allocator **)(in_RDI + 0x148);
        in_stack_fffffffffffff220 = &local_a80;
        local_a80.refcount = (int *)0x0;
        local_a80.d = 1;
        local_8 = (long)local_25c * (long)local_260 * local_278;
        local_c = 0x10;
        local_a80.cstep = (local_8 + 0xfU & 0xfffffffffffffff0) / local_278;
        local_a80.dims = *(int *)(in_RDI + 0x150) + -1;
        if (*(int *)(in_RDI + 0x150) == 4) {
          local_a80.cstep = (long)*(int *)(in_RDI + 0x154) * (long)*(int *)(in_RDI + 0x158);
        }
        local_6c0 = (undefined8 *)(in_RDI + 0x170);
        local_6b8 = &local_ac8;
        local_224 = *(int *)(in_RDI + 0x19c);
        local_228 = *(int *)(in_RDI + 0x1a0);
        local_22c = *(undefined4 *)(in_RDI + 0x1a4);
        local_238 = (void *)*local_6c0;
        local_240 = *(ulong *)(in_RDI + 0x180);
        local_244 = *(undefined4 *)(in_RDI + 0x188);
        local_250 = *(long **)(in_RDI + 400);
        local_220 = &local_ac8;
        local_ac0 = (int *)0x0;
        local_a94 = 1;
        local_18 = (long)local_224 * (long)local_228 * local_240;
        local_a88 = (local_18 + 0xfU & 0xfffffffffffffff0) / local_240;
        local_aa0 = *(int *)(in_RDI + 0x198) + -1;
        if (*(int *)(in_RDI + 0x198) == 4) {
          local_a88 = (long)*(int *)(in_RDI + 0x19c) * (long)*(int *)(in_RDI + 0x1a0);
        }
        local_6e0 = (undefined8 *)(in_RDI + 0xe0);
        local_6d8 = &local_b10;
        local_1ec = *(int *)(in_RDI + 0x10c);
        local_1f0 = *(int *)(in_RDI + 0x110);
        local_1f4 = *(undefined4 *)(in_RDI + 0x114);
        local_200 = (void *)*local_6e0;
        local_208 = *(ulong *)(in_RDI + 0xf0);
        local_20c = *(undefined4 *)(in_RDI + 0xf8);
        local_218 = *(long **)(in_RDI + 0x100);
        local_1e8 = &local_b10;
        local_b08 = (int *)0x0;
        local_adc = 1;
        local_28 = (long)local_1ec * (long)local_1f0 * local_208;
        local_ad0 = (local_28 + 0xfU & 0xfffffffffffffff0) / local_208;
        local_ae8 = *(int *)(in_RDI + 0x108) + -1;
        if (*(int *)(in_RDI + 0x108) == 4) {
          local_ad0 = (long)*(int *)(in_RDI + 0x10c) * (long)*(int *)(in_RDI + 0x110);
        }
        local_1c = 0x10;
        local_2c = 0x10;
        local_6a5 = 1;
        local_6c4 = 0;
        local_6c5 = 1;
        local_6e4 = 0;
        local_6e5 = 1;
        in_stack_ffffffffffffefd8 = local_988;
        in_stack_fffffffffffff208 = local_980;
        local_6a0 = puVar3;
        local_258 = in_stack_fffffffffffff220;
        local_b10 = local_200;
        local_b00 = local_208;
        local_af8 = local_20c;
        local_af0 = local_218;
        local_ae4 = local_1ec;
        local_ae0 = local_1f0;
        local_ad8 = local_1f4;
        local_ac8 = local_238;
        local_ab8 = local_240;
        local_ab0 = local_244;
        local_aa8 = local_250;
        local_a9c = local_224;
        local_a98 = local_228;
        local_a90 = local_22c;
        local_a80.data = local_270;
        local_a80.elemsize = local_278;
        local_a80.elempack = local_27c;
        local_a80.allocator = local_288;
        local_a80.w = local_25c;
        local_a80.h = local_260;
        local_a80.c = local_264;
        iVar1 = lstm((Mat *)(ulong)in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                     (int)((ulong)puVar3 >> 0x20),
                     (Mat *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),local_980,
                     local_978,(Mat *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                     in_stack_fffffffffffff3f8,in_stack_fffffffffffff400);
        iVar2 = (int)((ulong)puVar3 >> 0x20);
        local_960 = &local_b10;
        in_stack_fffffffffffff200 = local_978;
        local_3f0 = local_960;
        if (local_b08 != (int *)0x0) {
          local_3f4 = 0xffffffff;
          LOCK();
          local_3f8 = *local_b08;
          *local_b08 = *local_b08 + -1;
          UNLOCK();
          if (local_3f8 == 1) {
            if (local_af0 == (long *)0x0) {
              local_3e8 = local_b10;
              if (local_b10 != (void *)0x0) {
                free(local_b10);
                in_stack_fffffffffffff200 = local_978;
              }
            }
            else {
              (**(code **)(*local_af0 + 0x18))(local_af0,local_b10);
              in_stack_fffffffffffff200 = local_978;
            }
          }
        }
        local_b10 = (void *)0x0;
        local_b00 = 0;
        local_af8 = 0;
        local_ae8 = 0;
        local_ae4 = 0;
        local_ae0 = 0;
        local_adc = 0;
        local_ad8 = 0;
        local_ad0 = 0;
        local_b08 = (int *)0x0;
        local_950 = &local_ac8;
        local_410 = local_950;
        if (local_ac0 != (int *)0x0) {
          local_414 = 0xffffffff;
          LOCK();
          local_418 = *local_ac0;
          *local_ac0 = *local_ac0 + -1;
          UNLOCK();
          if (local_418 == 1) {
            if (local_aa8 == (long *)0x0) {
              local_3d8 = local_ac8;
              if (local_ac8 != (void *)0x0) {
                free(local_ac8);
              }
            }
            else {
              (**(code **)(*local_aa8 + 0x18))(local_aa8,local_ac8);
            }
          }
        }
        local_ac8 = (void *)0x0;
        local_ab8 = 0;
        local_ab0 = 0;
        local_aa0 = 0;
        local_a9c = 0;
        local_a98 = 0;
        local_a94 = 0;
        local_a90 = 0;
        local_a88 = 0;
        local_ac0 = (int *)0x0;
        local_940 = &local_a80;
        local_430 = local_940;
        if (local_a80.refcount != (int *)0x0) {
          local_434 = 0xffffffff;
          LOCK();
          local_438 = *local_a80.refcount;
          *local_a80.refcount = *local_a80.refcount + -1;
          UNLOCK();
          if (local_438 == 1) {
            if (local_a80.allocator == (Allocator *)0x0) {
              local_3c8 = local_a80.data;
              if (local_a80.data != (void *)0x0) {
                free(local_a80.data);
              }
            }
            else {
              (*(local_a80.allocator)->_vptr_Allocator[3])(local_a80.allocator,local_a80.data);
            }
          }
        }
        local_a80.data = (void *)0x0;
        local_a80.elemsize = 0;
        local_a80.elempack = 0;
        local_a80.dims = 0;
        local_a80.w = 0;
        local_a80.h = 0;
        local_a80.d = 0;
        local_a80.c = 0;
        local_a80.cstep = 0;
        local_a80.refcount = (int *)0x0;
        local_a34 = iVar1;
        if (iVar1 != 0) {
          local_9e8 = 1;
          local_964 = iVar1;
          goto LAB_0128f2da;
        }
      }
      if (*(int *)(in_RDI + 0xd8) == 2) {
        local_674 = *(undefined4 *)(in_RDI + 0xd0);
        local_688 = local_988[2]._vptr_Allocator;
        local_670 = &local_b58;
        local_678 = local_98c;
        local_680 = 4;
        local_b58 = (void *)0x0;
        local_b50 = (int *)0x0;
        local_b48 = 0;
        local_b40 = 0;
        local_b38 = (long *)0x0;
        local_b30 = 0;
        local_b2c = 0;
        local_b28 = 0;
        local_b24 = 0;
        local_b20 = 0;
        local_b18 = 0;
        Mat::create(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8,
                    in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
        local_888 = &local_b58;
        if (local_b58 != (void *)0x0) {
          local_298 = local_888;
        }
        local_e79 = local_b58 != (void *)0x0 && local_b18 * local_b20 != 0;
        if (local_e79) {
          local_654 = *(undefined4 *)(in_RDI + 0xd0);
          local_668 = local_988[2]._vptr_Allocator;
          local_650 = &local_ba0;
          local_658 = local_98c;
          local_660 = 4;
          local_ba0 = (void *)0x0;
          local_b98 = (int *)0x0;
          local_b90 = 0;
          local_b88 = 0;
          local_b80 = (long *)0x0;
          local_b78 = 0;
          local_b74 = 0;
          local_b70 = 0;
          local_b6c = 0;
          local_b68 = 0;
          local_b60 = 0;
          Mat::create(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8,
                      in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
          local_890 = &local_ba0;
          if (local_ba0 != (void *)0x0) {
            local_290 = local_890;
          }
          local_e99 = local_ba0 != (void *)0x0 && local_b60 * local_b68 != 0;
          if (local_e99) {
            local_700 = (undefined8 *)(in_RDI + 0x128);
            local_6f8 = &local_bf0;
            local_1b4 = *(int *)(in_RDI + 0x154);
            local_1b8 = *(int *)(in_RDI + 0x158);
            local_1bc = *(undefined4 *)(in_RDI + 0x15c);
            local_1c8 = (void *)*local_700;
            local_1d0 = *(ulong *)(in_RDI + 0x138);
            local_1d4 = *(undefined4 *)(in_RDI + 0x140);
            local_1e0 = *(long **)(in_RDI + 0x148);
            local_1b0 = &local_bf0;
            local_be8 = (int *)0x0;
            local_bbc = 1;
            local_38 = (long)local_1b4 * (long)local_1b8 * local_1d0;
            local_bb0 = (local_38 + 0xfU & 0xfffffffffffffff0) / local_1d0;
            local_bc8 = *(int *)(in_RDI + 0x150) + -1;
            if (*(int *)(in_RDI + 0x150) == 4) {
              local_bb0 = (long)*(int *)(in_RDI + 0x154) * (long)*(int *)(in_RDI + 0x158);
            }
            local_720 = (undefined8 *)(in_RDI + 0x170);
            local_718 = &local_c38;
            local_17c = *(int *)(in_RDI + 0x19c);
            local_180 = *(undefined4 *)(in_RDI + 0x1a0);
            local_184 = *(undefined4 *)(in_RDI + 0x1a4);
            local_190 = (void *)*local_720;
            local_198 = *(long *)(in_RDI + 0x180);
            local_19c = *(undefined4 *)(in_RDI + 0x188);
            local_1a8 = *(long **)(in_RDI + 400);
            local_178 = &local_c38;
            local_c30 = (int *)0x0;
            uVar7 = 1;
            local_48 = (long)local_17c * (long)(int)in_stack_fffffffffffff3f8 * local_198;
            local_740 = (undefined8 *)(in_RDI + 0xe0);
            local_738 = &local_c80;
            local_144 = *(int *)(in_RDI + 0x10c);
            local_148 = *(int *)(in_RDI + 0x110);
            local_14c = *(undefined4 *)(in_RDI + 0x114);
            local_158 = (void *)*local_740;
            local_160 = *(ulong *)(in_RDI + 0xf0);
            local_164 = *(undefined4 *)(in_RDI + 0xf8);
            local_170 = *(long **)(in_RDI + 0x100);
            local_140 = &local_c80;
            local_c78 = (int *)0x0;
            local_c4c = 1;
            local_58 = (long)local_144 * (long)local_148 * local_160;
            local_c40 = (local_58 + 0xfU & 0xfffffffffffffff0) / local_160;
            local_c58 = *(int *)(in_RDI + 0x108) + -1;
            if (*(int *)(in_RDI + 0x108) == 4) {
              local_c40 = (long)*(int *)(in_RDI + 0x10c) * (long)*(int *)(in_RDI + 0x110);
            }
            local_3c = 0x10;
            local_4c = 0x10;
            local_5c = 0x10;
            local_704 = 0;
            local_705 = 1;
            local_724 = 0;
            local_725 = 1;
            local_744 = 0;
            local_745 = 1;
            local_c80 = local_158;
            local_c70 = local_160;
            local_c68 = local_164;
            local_c60 = local_170;
            local_c54 = local_144;
            local_c50 = local_148;
            local_c48 = local_14c;
            local_c38 = local_190;
            local_c28 = local_198;
            local_c20 = local_19c;
            local_c18 = local_1a8;
            local_bf0 = local_1c8;
            local_be0 = local_1d0;
            local_bd8 = local_1d4;
            local_bd0 = local_1e0;
            local_bc4 = local_1b4;
            local_bc0 = local_1b8;
            local_bb8 = local_1bc;
            iVar1 = lstm((Mat *)CONCAT17(local_dc2,in_stack_fffffffffffff228),
                         in_stack_fffffffffffff220,iVar2,
                         (Mat *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                         in_stack_fffffffffffff208,in_stack_fffffffffffff200,
                         (Mat *)CONCAT44(local_17c,*(int *)(in_RDI + 0x198) + -1),
                         in_stack_fffffffffffff3f8,in_stack_fffffffffffff400);
            local_930 = &local_c80;
            local_450 = local_930;
            if (local_c78 != (int *)0x0) {
              local_454 = 0xffffffff;
              LOCK();
              local_458 = *local_c78;
              *local_c78 = *local_c78 + -1;
              UNLOCK();
              if (local_458 == 1) {
                if (local_c60 == (long *)0x0) {
                  local_3b8 = local_c80;
                  if (local_c80 != (void *)0x0) {
                    free(local_c80);
                  }
                }
                else {
                  (**(code **)(*local_c60 + 0x18))(local_c60,local_c80);
                }
              }
            }
            local_c80 = (void *)0x0;
            local_c70 = 0;
            local_c68 = 0;
            local_c58 = 0;
            local_c54 = 0;
            local_c50 = 0;
            local_c4c = 0;
            local_c48 = 0;
            local_c40 = 0;
            local_c78 = (int *)0x0;
            local_920 = &local_c38;
            local_470 = local_920;
            if (local_c30 != (int *)0x0) {
              local_474 = 0xffffffff;
              LOCK();
              local_478 = *local_c30;
              *local_c30 = *local_c30 + -1;
              UNLOCK();
              if (local_478 == 1) {
                if (local_c18 == (long *)0x0) {
                  local_3a8 = local_c38;
                  if (local_c38 != (void *)0x0) {
                    free(local_c38);
                  }
                }
                else {
                  (**(code **)(*local_c18 + 0x18))(local_c18,local_c38);
                }
              }
            }
            local_c38 = (void *)0x0;
            local_c28 = 0;
            local_c20 = 0;
            uVar7 = 0;
            uVar5 = 0;
            uVar6 = 0;
            uVar6 = 0;
            local_c30 = (int *)0x0;
            local_910 = &local_bf0;
            local_490 = local_910;
            if (local_be8 != (int *)0x0) {
              local_494 = 0xffffffff;
              LOCK();
              local_498 = *local_be8;
              *local_be8 = *local_be8 + -1;
              UNLOCK();
              if (local_498 == 1) {
                if (local_bd0 == (long *)0x0) {
                  local_398 = local_bf0;
                  if (local_bf0 != (void *)0x0) {
                    free(local_bf0);
                  }
                }
                else {
                  (**(code **)(*local_bd0 + 0x18))(local_bd0,local_bf0);
                }
              }
            }
            local_bf0 = (void *)0x0;
            local_be0 = 0;
            local_bd8 = 0;
            local_bc8 = 0;
            local_bc4 = 0;
            local_bc0 = 0;
            local_bbc = 0;
            local_bb8 = 0;
            local_bb0 = 0;
            local_be8 = (int *)0x0;
            local_ba4 = iVar1;
            if (iVar1 == 0) {
              local_7f0 = &local_9d8;
              local_7f8 = (int)local_998 * local_9a0;
              local_800 = local_9d8;
              for (local_804 = 0; local_804 < local_7f8; local_804 = local_804 + 1) {
                *local_800 = 0;
                local_800 = local_800 + 1;
              }
              local_810 = &local_a30;
              local_818 = (int)local_9f0 * local_9f8;
              local_820 = local_a30;
              for (local_824 = 0; local_824 < local_818; local_824 = local_824 + 1) {
                *local_820 = 0;
                local_820 = local_820 + 1;
              }
              local_760 = (long *)(in_RDI + 0x128);
              local_758 = &local_cd0;
              local_10c = *(int *)(in_RDI + 0x154);
              local_110 = *(int *)(in_RDI + 0x158);
              local_114 = *(undefined4 *)(in_RDI + 0x15c);
              local_120 = (void *)(*local_760 +
                                  *(long *)(in_RDI + 0x168) * *(long *)(in_RDI + 0x138));
              local_128 = *(ulong *)(in_RDI + 0x138);
              local_12c = *(undefined4 *)(in_RDI + 0x140);
              local_138 = *(long **)(in_RDI + 0x148);
              local_108 = &local_cd0;
              local_cc8 = (int *)0x0;
              local_c9c = 1;
              local_68 = (long)local_10c * (long)local_110 * local_128;
              local_c90 = (local_68 + 0xfU & 0xfffffffffffffff0) / local_128;
              local_ca8 = *(int *)(in_RDI + 0x150) + -1;
              if (*(int *)(in_RDI + 0x150) == 4) {
                local_c90 = (long)*(int *)(in_RDI + 0x154) * (long)*(int *)(in_RDI + 0x158);
              }
              local_780 = (long *)(in_RDI + 0x170);
              local_778 = &local_d18;
              local_d4 = *(int *)(in_RDI + 0x19c);
              local_d8 = *(int *)(in_RDI + 0x1a0);
              local_dc = *(undefined4 *)(in_RDI + 0x1a4);
              local_e8 = (void *)(*local_780 + *(long *)(in_RDI + 0x1b0) * *(long *)(in_RDI + 0x180)
                                 );
              local_f0 = *(ulong *)(in_RDI + 0x180);
              local_f4 = *(undefined4 *)(in_RDI + 0x188);
              local_100 = *(long **)(in_RDI + 400);
              local_d0 = &local_d18;
              local_d10 = (int *)0x0;
              local_ce4 = 1;
              local_78 = (long)local_d4 * (long)local_d8 * local_f0;
              local_cd8 = (local_78 + 0xfU & 0xfffffffffffffff0) / local_f0;
              local_cf0 = *(int *)(in_RDI + 0x198) + -1;
              if (*(int *)(in_RDI + 0x198) == 4) {
                local_cd8 = (long)*(int *)(in_RDI + 0x19c) * (long)*(int *)(in_RDI + 0x1a0);
              }
              local_7a0 = (long *)(in_RDI + 0xe0);
              local_798 = &local_d60;
              local_9c = *(int *)(in_RDI + 0x10c);
              local_a0 = *(int *)(in_RDI + 0x110);
              local_a4 = *(undefined4 *)(in_RDI + 0x114);
              local_b0 = (void *)(*local_7a0 + *(long *)(in_RDI + 0x120) * *(long *)(in_RDI + 0xf0))
              ;
              local_b8 = *(ulong *)(in_RDI + 0xf0);
              local_bc = *(undefined4 *)(in_RDI + 0xf8);
              local_c8 = *(long **)(in_RDI + 0x100);
              local_98 = &local_d60;
              local_d58 = (int *)0x0;
              local_d2c = 1;
              local_88 = (long)local_9c * (long)local_a0 * local_b8;
              local_d20 = (local_88 + 0xfU & 0xfffffffffffffff0) / local_b8;
              local_d38 = *(int *)(in_RDI + 0x108) + -1;
              if (*(int *)(in_RDI + 0x108) == 4) {
                local_d20 = (long)*(int *)(in_RDI + 0x10c) * (long)*(int *)(in_RDI + 0x110);
              }
              local_6c = 0x10;
              local_7c = 0x10;
              local_8c = 0x10;
              local_764 = 1;
              local_765 = 1;
              local_784 = 1;
              local_785 = 1;
              local_7a4 = 1;
              local_7a5 = 1;
              local_7f4 = 0;
              local_814 = 0;
              local_bb0 = 0;
              local_bc8 = 0;
              local_2c0 = local_7f0;
              local_2b8 = local_810;
              local_d60 = local_b0;
              local_d50 = local_b8;
              local_d48 = local_bc;
              local_d40 = local_c8;
              local_d34 = local_9c;
              local_d30 = local_a0;
              local_d28 = local_a4;
              local_d18 = local_e8;
              local_d08 = local_f0;
              local_d00 = local_f4;
              local_cf8 = local_100;
              local_cec = local_d4;
              local_ce8 = local_d8;
              local_ce0 = local_dc;
              local_cd0 = local_120;
              local_cc0 = local_128;
              local_cb8 = local_12c;
              local_cb0 = local_138;
              local_ca4 = local_10c;
              local_ca0 = local_110;
              local_c98 = local_114;
              iVar2 = lstm((Mat *)CONCAT17(local_dc2,in_stack_fffffffffffff228),
                           in_stack_fffffffffffff220,iVar2,
                           (Mat *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                           in_stack_fffffffffffff208,in_stack_fffffffffffff200,
                           (Mat *)CONCAT44(uVar5,uVar7),in_stack_fffffffffffff3f8,
                           in_stack_fffffffffffff400);
              local_900 = &local_d60;
              local_4b0 = local_900;
              if (local_d58 != (int *)0x0) {
                local_4b4 = 0xffffffff;
                LOCK();
                local_4b8 = *local_d58;
                *local_d58 = *local_d58 + -1;
                UNLOCK();
                if (local_4b8 == 1) {
                  if (local_d40 == (long *)0x0) {
                    local_388 = local_d60;
                    if (local_d60 != (void *)0x0) {
                      free(local_d60);
                    }
                  }
                  else {
                    (**(code **)(*local_d40 + 0x18))(local_d40,local_d60);
                  }
                }
              }
              local_d60 = (void *)0x0;
              local_d50 = 0;
              local_d48 = 0;
              local_d38 = 0;
              local_d34 = 0;
              local_d30 = 0;
              local_d2c = 0;
              local_d28 = 0;
              local_d20 = 0;
              local_d58 = (int *)0x0;
              local_8f0 = &local_d18;
              local_4d0 = local_8f0;
              if (local_d10 != (int *)0x0) {
                local_4d4 = 0xffffffff;
                LOCK();
                local_4d8 = *local_d10;
                *local_d10 = *local_d10 + -1;
                UNLOCK();
                if (local_4d8 == 1) {
                  if (local_cf8 == (long *)0x0) {
                    local_378 = local_d18;
                    if (local_d18 != (void *)0x0) {
                      free(local_d18);
                    }
                  }
                  else {
                    (**(code **)(*local_cf8 + 0x18))(local_cf8,local_d18);
                  }
                }
              }
              local_d18 = (void *)0x0;
              local_d08 = 0;
              local_d00 = 0;
              local_cf0 = 0;
              local_cec = 0;
              local_ce8 = 0;
              local_ce4 = 0;
              local_ce0 = 0;
              local_cd8 = 0;
              local_d10 = (int *)0x0;
              local_8e0 = &local_cd0;
              local_4f0 = local_8e0;
              if (local_cc8 != (int *)0x0) {
                local_4f4 = 0xffffffff;
                LOCK();
                local_4f8 = *local_cc8;
                *local_cc8 = *local_cc8 + -1;
                UNLOCK();
                if (local_4f8 == 1) {
                  if (local_cb0 == (long *)0x0) {
                    local_368 = local_cd0;
                    if (local_cd0 != (void *)0x0) {
                      free(local_cd0);
                    }
                  }
                  else {
                    (**(code **)(*local_cb0 + 0x18))(local_cb0,local_cd0);
                  }
                }
              }
              local_cd0 = (void *)0x0;
              local_cc0 = 0;
              local_cb8 = 0;
              local_ca8 = 0;
              local_ca4 = 0;
              local_ca0 = 0;
              local_c9c = 0;
              local_c98 = 0;
              local_c90 = 0;
              local_cc8 = (int *)0x0;
              local_c84 = iVar2;
              if (iVar2 == 0) {
                for (local_d64 = 0; local_d64 < local_98c; local_d64 = local_d64 + 1) {
                  local_620 = &local_b58;
                  local_624 = local_d64;
                  local_630 = &local_ba0;
                  local_634 = local_d64;
                  __src = (void *)((long)local_ba0 + (long)local_b74 * (long)local_d64 * local_b90);
                  local_640 = local_980;
                  local_644 = local_d64;
                  __dest = (void *)((long)local_980->data +
                                   (long)local_980->w * (long)local_d64 * local_980->elemsize);
                  memcpy(__dest,(void *)((long)local_b58 +
                                        (long)local_b2c * (long)local_d64 * local_b48),
                         (long)*(int *)(in_RDI + 0xd0) << 2);
                  memcpy((void *)((long)__dest + (long)*(int *)(in_RDI + 0xd0) * 4),__src,
                         (long)*(int *)(in_RDI + 0xd0) << 2);
                }
                local_9e8 = 0;
              }
              else {
                local_9e8 = 1;
                local_964 = iVar2;
              }
            }
            else {
              local_9e8 = 1;
              local_964 = iVar1;
            }
          }
          else {
            local_964 = -100;
            local_9e8 = 1;
          }
          local_8d0 = &local_ba0;
          local_510 = local_8d0;
          if (local_b98 != (int *)0x0) {
            local_514 = 0xffffffff;
            LOCK();
            local_518 = *local_b98;
            *local_b98 = *local_b98 + -1;
            UNLOCK();
            if (local_518 == 1) {
              if (local_b80 == (long *)0x0) {
                local_358 = local_ba0;
                if (local_ba0 != (void *)0x0) {
                  free(local_ba0);
                }
              }
              else {
                (**(code **)(*local_b80 + 0x18))(local_b80,local_ba0);
              }
            }
          }
          local_ba0 = (void *)0x0;
          local_b90 = 0;
          local_b88 = 0;
          local_b78 = 0;
          local_b74 = 0;
          local_b70 = 0;
          local_b6c = 0;
          local_b68 = 0;
          local_b60 = 0;
          local_b98 = (int *)0x0;
        }
        else {
          local_964 = -100;
          local_9e8 = 1;
        }
        local_8c0 = &local_b58;
        local_530 = local_8c0;
        if (local_b50 != (int *)0x0) {
          local_534 = 0xffffffff;
          LOCK();
          local_538 = *local_b50;
          *local_b50 = *local_b50 + -1;
          UNLOCK();
          if (local_538 == 1) {
            if (local_b38 == (long *)0x0) {
              local_348 = local_b58;
              if (local_b58 != (void *)0x0) {
                free(local_b58);
              }
            }
            else {
              (**(code **)(*local_b38 + 0x18))(local_b38,local_b58);
            }
          }
        }
        local_b58 = (void *)0x0;
        local_b48 = 0;
        local_b40 = 0;
        local_b30 = 0;
        local_b2c = 0;
        local_b28 = 0;
        local_b24 = 0;
        local_b20 = 0;
        local_b18 = 0;
        local_b50 = (int *)0x0;
        if (local_9e8 != 0) goto LAB_0128f2da;
      }
      local_964 = 0;
      local_9e8 = 1;
    }
    else {
      local_964 = -100;
      local_9e8 = 1;
    }
  }
  else {
    local_964 = -100;
    local_9e8 = 1;
  }
LAB_0128f2da:
  local_8b0 = &local_a30;
  local_550 = local_8b0;
  if (local_a28 != (int *)0x0) {
    local_554 = 0xffffffff;
    LOCK();
    local_558 = *local_a28;
    *local_a28 = *local_a28 + -1;
    UNLOCK();
    if (local_558 == 1) {
      if (local_a10 == (long *)0x0) {
        local_338 = local_a30;
        if (local_a30 != (undefined4 *)0x0) {
          free(local_a30);
        }
      }
      else {
        (**(code **)(*local_a10 + 0x18))(local_a10,local_a30);
      }
    }
  }
  local_a30 = (undefined4 *)0x0;
  local_a20 = 0;
  local_a18 = 0;
  local_a08 = 0;
  local_a04 = 0;
  local_a00 = 0;
  local_9fc = 0;
  local_9f8 = 0;
  local_9f0 = 0;
  local_a28 = (int *)0x0;
LAB_0128f506:
  ppuVar4 = &local_9d8;
  if (local_9d0 != (int *)0x0) {
    local_574 = 0xffffffff;
    LOCK();
    local_578 = *local_9d0;
    *local_9d0 = *local_9d0 + -1;
    UNLOCK();
    if (local_578 == 1) {
      local_8a0 = ppuVar4;
      local_570 = ppuVar4;
      if (local_9b8 == (long *)0x0) {
        local_328 = local_9d8;
        if (local_9d8 != (undefined4 *)0x0) {
          free(local_9d8);
        }
      }
      else {
        (**(code **)(*local_9b8 + 0x18))(local_9b8,local_9d8);
      }
    }
  }
  *ppuVar4 = (undefined4 *)0x0;
  ppuVar4[2] = (undefined4 *)0x0;
  *(undefined4 *)(ppuVar4 + 3) = 0;
  *(undefined4 *)(ppuVar4 + 5) = 0;
  *(undefined4 *)((long)ppuVar4 + 0x2c) = 0;
  *(undefined4 *)(ppuVar4 + 6) = 0;
  *(undefined4 *)((long)ppuVar4 + 0x34) = 0;
  *(undefined4 *)(ppuVar4 + 7) = 0;
  ppuVar4[8] = (undefined4 *)0x0;
  ppuVar4[1] = (undefined4 *)0x0;
  return local_964;
}

Assistant:

int LSTM::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    Mat cell(num_output, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;
    cell.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret0 != 0)
            return ret0;

        hidden.fill(0.0f);
        cell.fill(0.0f);

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden, cell, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}